

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Vacuum(Parse *pParse,Token *pNm)

{
  Vdbe *p;
  int local_24;
  int iDb;
  Vdbe *v;
  Token *pNm_local;
  Parse *pParse_local;
  
  v = (Vdbe *)pNm;
  pNm_local = (Token *)pParse;
  p = sqlite3GetVdbe(pParse);
  local_24 = 0;
  if ((p != (Vdbe *)0x0) &&
     (((v == (Vdbe *)0x0 ||
       (local_24 = sqlite3TwoPartName((Parse *)pNm_local,(Token *)v,(Token *)v,(Token **)&v),
       -1 < local_24)) && (local_24 != 1)))) {
    sqlite3VdbeAddOp1(p,8,local_24);
    sqlite3VdbeUsesBtree(p,local_24);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Vacuum(Parse *pParse, Token *pNm){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int iDb = 0;
  if( v==0 ) return;
  if( pNm ){
#ifndef SQLITE_BUG_COMPATIBLE_20160819
    /* Default behavior:  Report an error if the argument to VACUUM is
    ** not recognized */
    iDb = sqlite3TwoPartName(pParse, pNm, pNm, &pNm);
    if( iDb<0 ) return;
#else
    /* When SQLITE_BUG_COMPATIBLE_20160819 is defined, unrecognized arguments
    ** to VACUUM are silently ignored.  This is a back-out of a bug fix that
    ** occurred on 2016-08-19 (https://www.sqlite.org/src/info/083f9e6270).
    ** The buggy behavior is required for binary compatibility with some
    ** legacy applications. */
    iDb = sqlite3FindDb(pParse->db, pNm);
    if( iDb<0 ) iDb = 0;
#endif
  }
  if( iDb!=1 ){
    sqlite3VdbeAddOp1(v, OP_Vacuum, iDb);
    sqlite3VdbeUsesBtree(v, iDb);
  }
  return;
}